

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O2

void __thiscall CrashTest_ThrowExceptionTest_Test::TestBody(CrashTest_ThrowExceptionTest_Test *this)

{
  bool bVar1;
  AssertHelper AStack_18;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ThrowException();
    }
  }
  testing::Message::Message((Message *)&local_10);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_18,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,0x22,"Expected: ThrowException() throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
  testing::internal::AssertHelper::~AssertHelper(&AStack_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_10);
  return;
}

Assistant:

TEST (CrashTest, ThrowExceptionTest) {
    ASSERT_ANY_THROW(ThrowException());
}